

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestBufferStreamEof(void)

{
  lazy_ostream *in_stack_ffffffffffffff78;
  basic_cstring<const_char> *this;
  lazy_ostream *prev;
  basic_cstring<const_char> local_30;
  begin *in_stack_ffffffffffffffe8;
  unit_test_log_t *in_stack_fffffffffffffff0;
  
  this = &local_30;
  prev = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
             ,0x6d);
  boost::unit_test::log::begin::begin
            ((begin *)&stack0xffffffffffffffe0,(const_string *)prev,(size_t)this);
  boost::unit_test::unit_test_log_t::operator<<(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8)
  ;
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)prev,(log_level)((ulong)this >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<(prev,(char (*) [20])this);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)this,in_stack_ffffffffffffff78);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[20],_const_char_(&)[20]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[20],_const_char_(&)[20]> *)
             0x23205d);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)this);
  TestEof<int>();
  TestEof<long>();
  TestEof<float>();
  TestEof<double>();
  return;
}

Assistant:

void TestBufferStreamEof()
{
    BOOST_TEST_MESSAGE( "TestBufferStreamEof");

    TestEof<int32_t>();

    TestEof<int64_t>();

    TestEof<float>();

    TestEof<double>();
}